

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_peer.cpp
# Opt level: O0

void __thiscall udpdiscovery::Peer::Stop(Peer *this,bool wait_for_threads)

{
  bool wait_for_threads_local;
  Peer *this_local;
  
  if (this->env_ != (PeerEnvInterface *)0x0) {
    (*this->env_->_vptr_PeerEnvInterface[4])();
    this->env_ = (PeerEnvInterface *)0x0;
    if (wait_for_threads) {
      if (this->sending_thread_ != (MinimalisticThreadInterface *)0x0) {
        (*this->sending_thread_->_vptr_MinimalisticThreadInterface[3])();
      }
      if (this->receiving_thread_ != (MinimalisticThreadInterface *)0x0) {
        (*this->receiving_thread_->_vptr_MinimalisticThreadInterface[3])();
      }
    }
    else {
      if (this->sending_thread_ != (MinimalisticThreadInterface *)0x0) {
        (*this->sending_thread_->_vptr_MinimalisticThreadInterface[2])();
      }
      if (this->receiving_thread_ != (MinimalisticThreadInterface *)0x0) {
        (*this->receiving_thread_->_vptr_MinimalisticThreadInterface[2])();
      }
    }
    if (this->sending_thread_ != (MinimalisticThreadInterface *)0x0) {
      (*this->sending_thread_->_vptr_MinimalisticThreadInterface[1])();
    }
    this->sending_thread_ = (MinimalisticThreadInterface *)0x0;
    if (this->receiving_thread_ != (MinimalisticThreadInterface *)0x0) {
      (*this->receiving_thread_->_vptr_MinimalisticThreadInterface[1])();
    }
    this->receiving_thread_ = (MinimalisticThreadInterface *)0x0;
  }
  return;
}

Assistant:

void Peer::Stop(bool wait_for_threads) {
  if (!env_) {
    return;
  }

  env_->Exit();

  // Threads live longer than the object itself. So env will be deleted in one
  // of the threads.
  env_ = 0;

  if (wait_for_threads) {
    if (sending_thread_) {
      sending_thread_->Join();
    }

    if (receiving_thread_) {
      receiving_thread_->Join();
    }
  } else {
    if (sending_thread_) {
      sending_thread_->Detach();
    }

    if (receiving_thread_) {
      receiving_thread_->Detach();
    }
  }

  delete sending_thread_;
  sending_thread_ = 0;
  delete receiving_thread_;
  receiving_thread_ = 0;
}